

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_image(nk_command_buffer *b,nk_rect r,nk_image *img,nk_color col)

{
  void *pvVar1;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  nk_rect *c;
  nk_command_image *cmd;
  float local_40;
  float local_3c;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RDI != 0) {
    if (*(int *)(in_RDI + 0x18) != 0) {
      if ((*(float *)(in_RDI + 0x10) == 0.0) && (!NAN(*(float *)(in_RDI + 0x10)))) {
        return;
      }
      if ((*(float *)(in_RDI + 0x14) == 0.0) && (!NAN(*(float *)(in_RDI + 0x14)))) {
        return;
      }
      if (in_XMM0_Da + in_XMM1_Da <= *(float *)(in_RDI + 8)) {
        return;
      }
      if (*(float *)(in_RDI + 8) + *(float *)(in_RDI + 0x10) <= in_XMM0_Da) {
        return;
      }
      if (in_XMM0_Db + in_XMM1_Db <= *(float *)(in_RDI + 0xc)) {
        return;
      }
      if (*(float *)(in_RDI + 0xc) + *(float *)(in_RDI + 0x14) <= in_XMM0_Db) {
        return;
      }
    }
    pvVar1 = nk_command_buffer_push
                       ((nk_command_buffer *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                        (nk_command_type)((ulong)in_RDI >> 0x20),(nk_size)in_RSI);
    if (pvVar1 != (void *)0x0) {
      *(short *)((long)pvVar1 + 0x10) = (short)(int)in_XMM0_Da;
      *(short *)((long)pvVar1 + 0x12) = (short)(int)in_XMM0_Db;
      local_3c = in_XMM1_Da;
      if (in_XMM1_Da <= 0.0) {
        local_3c = 0.0;
      }
      *(short *)((long)pvVar1 + 0x14) = (short)(int)local_3c;
      local_40 = in_XMM1_Db;
      if (in_XMM1_Db <= 0.0) {
        local_40 = 0.0;
      }
      *(short *)((long)pvVar1 + 0x16) = (short)(int)local_40;
      *(undefined8 *)((long)pvVar1 + 0x18) = *in_RSI;
      *(undefined8 *)((long)pvVar1 + 0x20) = in_RSI[1];
      *(undefined8 *)((long)pvVar1 + 0x28) = in_RSI[2];
      *(undefined4 *)((long)pvVar1 + 0x30) = in_EDX;
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_image(struct nk_command_buffer *b, struct nk_rect r,
const struct nk_image *img, struct nk_color col)
{
struct nk_command_image *cmd;
NK_ASSERT(b);
if (!b) return;
if (b->use_clipping) {
const struct nk_rect *c = &b->clip;
if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
return;
}

cmd = (struct nk_command_image*)
nk_command_buffer_push(b, NK_COMMAND_IMAGE, sizeof(*cmd));
if (!cmd) return;
cmd->x = (short)r.x;
cmd->y = (short)r.y;
cmd->w = (unsigned short)NK_MAX(0, r.w);
cmd->h = (unsigned short)NK_MAX(0, r.h);
cmd->img = *img;
cmd->col = col;
}